

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

xml_attribute __thiscall
pugi::xml_node::insert_attribute_before(xml_node *this,char_t *name_,xml_attribute *attr)

{
  ulong uVar1;
  xml_node_struct *pxVar2;
  xml_allocator *this_00;
  size_t sVar3;
  xml_attribute_struct *pxVar4;
  xml_attribute_struct *pxVar5;
  xml_memory_page *in_RAX;
  xml_attribute_struct *pxVar6;
  uint uVar7;
  xml_attribute_struct **ppxVar8;
  xml_attribute a;
  xml_attribute local_28;
  
  pxVar2 = this->_root;
  if ((pxVar2 != (xml_node_struct *)0x0) &&
     (((uVar7 = (uint)pxVar2->header & 0xf, uVar7 == 7 || (uVar7 == 2)) &&
      (attr->_attr != (xml_attribute_struct *)0x0)))) {
    ppxVar8 = &pxVar2->first_attribute;
    do {
      pxVar6 = *ppxVar8;
      if (pxVar6 == attr->_attr) break;
      ppxVar8 = &pxVar6->next_attribute;
    } while (pxVar6 != (xml_attribute_struct *)0x0);
    if (pxVar6 != (xml_attribute_struct *)0x0) {
      if (pxVar2 == (xml_node_struct *)0x0) {
        __assert_fail("object",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                      ,0x486,
                      "xml_allocator &pugi::impl::(anonymous namespace)::get_allocator(const Object *) [Object = pugi::xml_node_struct]"
                     );
      }
      this_00 = *(xml_allocator **)((long)pxVar2 - (pxVar2->header >> 8));
      sVar3 = this_00->_busy_size;
      uVar1 = sVar3 + 0x28;
      if (uVar1 < 0x7fd9) {
        local_28._attr = (xml_attribute_struct *)this_00->_root;
        this_00->_busy_size = uVar1;
        pxVar6 = (xml_attribute_struct *)
                 ((long)&((xml_memory_page *)local_28._attr)[1].allocator + sVar3);
      }
      else {
        local_28._attr = (xml_attribute_struct *)in_RAX;
        pxVar6 = (xml_attribute_struct *)
                 impl::anon_unknown_0::xml_allocator::allocate_memory_oob
                           (this_00,0x28,(xml_memory_page **)&local_28);
        if (pxVar6 == (xml_attribute_struct *)0x0) {
          return (xml_attribute)(xml_attribute_struct *)0x0;
        }
      }
      pxVar6->name = (char_t *)0x0;
      pxVar6->value = (char_t *)0x0;
      pxVar6->prev_attribute_c = (xml_attribute_struct *)0x0;
      pxVar6->next_attribute = (xml_attribute_struct *)0x0;
      pxVar6->header = ((long)pxVar6 - (long)local_28._attr) * 0x100;
      pxVar4 = attr->_attr;
      pxVar5 = pxVar4->prev_attribute_c;
      ppxVar8 = &this->_root->first_attribute;
      if (pxVar5->next_attribute != (xml_attribute_struct *)0x0) {
        ppxVar8 = &pxVar5->next_attribute;
      }
      *ppxVar8 = pxVar6;
      pxVar6->prev_attribute_c = pxVar5;
      pxVar6->next_attribute = pxVar4;
      pxVar4->prev_attribute_c = pxVar6;
      local_28._attr = pxVar6;
      xml_attribute::set_name(&local_28,name_);
      return (xml_attribute)pxVar6;
    }
  }
  return (xml_attribute)(xml_attribute_struct *)0x0;
}

Assistant:

PUGI__FN xml_node_type xml_node::type() const
	{
		return _root ? PUGI__NODETYPE(_root) : node_null;
	}